

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFuzzyImageCompare.cpp
# Opt level: O1

float tcu::fuzzyCompare(FuzzyCompareParams *params,ConstPixelBufferAccess *ref,
                       ConstPixelBufferAccess *cmp,PixelBufferAccess *errorMask)

{
  ChannelOrder CVar1;
  int iVar2;
  double dVar3;
  undefined8 uVar4;
  deUint32 dVar5;
  uint uVar6;
  pointer pfVar7;
  InternalError *this;
  int y;
  int x;
  uint width;
  value_type_conflict3 *__val;
  ulong uVar8;
  bool bVar9;
  float fVar10;
  double dVar11;
  vector<float,_std::allocator<float>_> kernel;
  ConstPixelBufferAccess refAccess;
  ConstPixelBufferAccess cmpAccess;
  TextureLevel cmpFiltered;
  TextureLevel refFiltered;
  Random rnd;
  ulong local_1a0;
  ulong local_190;
  vector<float,_std::allocator<float>_> local_188;
  int local_168;
  int local_164;
  ConstPixelBufferAccess local_160;
  PixelBufferAccess *local_138;
  ConstPixelBufferAccess local_130;
  ConstPixelBufferAccess local_108;
  pointer local_e0;
  ulong local_d8;
  ulong local_d0;
  void *local_c8;
  void *local_c0;
  ulong local_b8;
  FuzzyCompareParams *local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  TextureLevel local_90;
  TextureLevel local_68;
  deRandom local_40;
  
  local_138 = errorMask;
  local_b0 = params;
  if (((((ref->m_format).type == UNORM_INT8) && ((ref->m_format).order - RGB < 2)) &&
      ((cmp->m_format).type == UNORM_INT8)) && ((cmp->m_format).order - RGB < 2)) {
    width = (ref->m_size).m_data[0];
    uVar6 = (ref->m_size).m_data[1];
    deRandom_init(&local_40,0x29b);
    local_90.m_format.order = RGBA;
    local_90.m_format.type = UNORM_INT8;
    TextureLevel::TextureLevel(&local_68,&local_90.m_format,width,uVar6,1);
    local_160.m_format.order = RGBA;
    local_160.m_format.type = UNORM_INT8;
    TextureLevel::TextureLevel(&local_90,&local_160.m_format,width,uVar6,1);
    local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pfVar7 = (pointer)operator_new(0xc);
    local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = pfVar7 + 3;
    *pfVar7 = 0.0;
    pfVar7[1] = 0.0;
    pfVar7[2] = 0.0;
    pfVar7[2] = 0.1;
    pfVar7[0] = 0.1;
    pfVar7[1] = 0.8;
    CVar1 = (ref->m_format).order;
    local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = pfVar7;
    local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
         ._M_finish;
    if (CVar1 == RGB) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_160,&local_68);
      separableConvolve<4,3>((PixelBufferAccess *)&local_160,ref,1,1,&local_188,&local_188);
    }
    else if (CVar1 == RGBA) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_160,&local_68);
      separableConvolve<4,4>((PixelBufferAccess *)&local_160,ref,1,1,&local_188,&local_188);
    }
    CVar1 = (cmp->m_format).order;
    if (CVar1 == RGB) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_160,&local_90);
      separableConvolve<4,3>((PixelBufferAccess *)&local_160,cmp,1,1,&local_188,&local_188);
    }
    else if (CVar1 == RGBA) {
      PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&local_160,&local_90);
      separableConvolve<4,4>((PixelBufferAccess *)&local_160,cmp,1,1,&local_188,&local_188);
    }
    local_160.m_format.order = R;
    local_160.m_format.type = 0x3f800000;
    local_160.m_size.m_data[0] = 0;
    local_160.m_size.m_data[1] = 0x3f800000;
    clear(local_138,(Vec4 *)&local_160);
    TextureLevel::getAccess((PixelBufferAccess *)&local_108,&local_68);
    local_160.m_format = local_108.m_format;
    local_160.m_size.m_data[0] = local_108.m_size.m_data[0];
    local_160.m_size.m_data[1] = local_108.m_size.m_data[1];
    local_160.m_size.m_data[2] = local_108.m_size.m_data[2];
    local_160.m_pitch.m_data[0] = local_108.m_pitch.m_data[0];
    local_160.m_pitch.m_data[1] = local_108.m_pitch.m_data[1];
    local_160.m_pitch.m_data[2] = local_108.m_pitch.m_data[2];
    local_c0 = local_108.m_data;
    local_160.m_data = local_108.m_data;
    TextureLevel::getAccess((PixelBufferAccess *)&local_130,&local_90);
    local_108.m_size.m_data[0] = local_130.m_size.m_data[0];
    local_108.m_size.m_data[1] = local_130.m_size.m_data[1];
    local_108.m_size.m_data[2] = local_130.m_size.m_data[2];
    local_108.m_pitch.m_data[0] = local_130.m_pitch.m_data[0];
    local_108.m_pitch.m_data[1] = local_130.m_pitch.m_data[1];
    uVar4 = local_108.m_pitch.m_data._0_8_;
    local_108.m_pitch.m_data[2] = local_130.m_pitch.m_data[2];
    local_c8 = local_130.m_data;
    local_108.m_data = local_130.m_data;
    dVar3 = 0.0;
    dVar11 = 0.0;
    if (1 < (int)(uVar6 - 1)) {
      local_164 = local_160.m_pitch.m_data[1];
      local_108.m_pitch.m_data[1] = local_130.m_pitch.m_data[1];
      local_168 = local_108.m_pitch.m_data[1];
      local_b8 = (ulong)(uVar6 - 1);
      uVar8 = 0;
      local_190 = 1;
      local_1a0 = 0;
      local_108.m_pitch.m_data._0_8_ = uVar4;
      local_e0 = pfVar7;
      local_d8 = (ulong)width;
      local_d0 = (ulong)uVar6;
      do {
        if (1 < (int)(width - 1)) {
          y = (int)local_190;
          local_a0 = (long)(local_164 * y) + (long)local_c0;
          local_a8 = (long)(local_168 * y) + (long)local_c8;
          x = 1;
          do {
            dVar5 = distSquaredToNeighbor<4>
                              ((Random *)&local_40,*(deUint32 *)(local_a0 + x * 4),&local_108,x,y);
            local_98 = uVar8;
            uVar6 = distSquaredToNeighbor<4>
                              ((Random *)&local_40,*(deUint32 *)(local_a8 + x * 4),&local_160,x,y);
            if (dVar5 < uVar6) {
              uVar6 = dVar5;
            }
            bVar9 = CARRY8(local_1a0,(ulong)(uVar6 * uVar6));
            local_1a0 = local_1a0 + uVar6 * uVar6;
            if (bVar9) {
              local_1a0 = 0xffffffffffffffff;
            }
            ConstPixelBufferAccess::getPixel(&local_130,(int)cmp,x,y);
            fVar10 = ((float)uVar6 / 63001.0) * ((float)uVar6 / 63001.0) * 500.0;
            local_130.m_format.type =
                 (ChannelType)
                 (((float)local_130.m_size.m_data[0] * 0.0722 +
                  (float)local_130.m_format.order * 0.2126 + (float)local_130.m_format.type * 0.7152
                  ) * 0.3 + 0.7);
            local_130.m_format.order = (ChannelOrder)(fVar10 * (float)local_130.m_format.type);
            local_130.m_format.type = (ChannelType)((1.0 - fVar10) * (float)local_130.m_format.type)
            ;
            local_130.m_size.m_data[0] = 0;
            local_130.m_size.m_data[1] = 0x3f800000;
            PixelBufferAccess::setPixel(local_138,(Vec4 *)&local_130,x,y,0);
            iVar2 = local_b0->maxSampleSkip;
            if (iVar2 < 1) {
              uVar6 = 1;
            }
            else {
              dVar5 = deRandom_getUint32(&local_40);
              uVar6 = dVar5 % (iVar2 + 1U);
            }
            x = uVar6 + x;
            uVar8 = (ulong)((int)local_98 + 1);
          } while (x < (int)(width - 1));
        }
        local_190 = local_190 + 1;
      } while (local_190 != local_b8);
      dVar11 = (double)(int)uVar8;
      dVar3 = ((double)CONCAT44(0x45300000,(int)(local_1a0 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_1a0) - 4503599627370496.0);
      uVar6 = (uint)local_d0;
      width = (uint)local_d8;
      pfVar7 = local_e0;
    }
    operator_delete(pfVar7,0xc);
    TextureLevel::~TextureLevel(&local_90);
    TextureLevel::~TextureLevel(&local_68);
    return (float)((dVar3 / 3969126001.0) * ((double)(int)((uVar6 - 2) * (width - 2)) / dVar11));
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  InternalError::InternalError
            (this,"Unsupported format in fuzzy comparison",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFuzzyImageCompare.cpp"
             ,0x117);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

float fuzzyCompare (const FuzzyCompareParams& params, const ConstPixelBufferAccess& ref, const ConstPixelBufferAccess& cmp, const PixelBufferAccess& errorMask)
{
	DE_ASSERT(ref.getWidth() == cmp.getWidth() && ref.getHeight() == cmp.getHeight());
	DE_ASSERT(errorMask.getWidth() == ref.getWidth() && errorMask.getHeight() == ref.getHeight());

	if (!isFormatSupported(ref.getFormat()) || !isFormatSupported(cmp.getFormat()))
		throw InternalError("Unsupported format in fuzzy comparison", DE_NULL, __FILE__, __LINE__);

	int			width	= ref.getWidth();
	int			height	= ref.getHeight();
	de::Random	rnd		(667);

	// Filtered
	TextureLevel refFiltered(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), width, height);
	TextureLevel cmpFiltered(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), width, height);

	// Kernel = {0.1, 0.8, 0.1}
	vector<float> kernel(3);
	kernel[0] = kernel[2] = 0.1f; kernel[1]= 0.8f;
	int shift = (int)(kernel.size() - 1) / 2;

	switch (ref.getFormat().order)
	{
		case TextureFormat::RGBA:	separableConvolve<4, 4>(refFiltered, ref, shift, shift, kernel, kernel);	break;
		case TextureFormat::RGB:	separableConvolve<4, 3>(refFiltered, ref, shift, shift, kernel, kernel);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (cmp.getFormat().order)
	{
		case TextureFormat::RGBA:	separableConvolve<4, 4>(cmpFiltered, cmp, shift, shift, kernel, kernel);	break;
		case TextureFormat::RGB:	separableConvolve<4, 3>(cmpFiltered, cmp, shift, shift, kernel, kernel);	break;
		default:
			DE_ASSERT(DE_FALSE);
	}

	int			numSamples	= 0;
	deUint64	distSum4	= 0ull;

	// Clear error mask to green.
	clear(errorMask, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

	ConstPixelBufferAccess refAccess = refFiltered.getAccess();
	ConstPixelBufferAccess cmpAccess = cmpFiltered.getAccess();

	for (int y = 1; y < height-1; y++)
	{
		for (int x = 1; x < width-1; x += params.maxSampleSkip > 0 ? (int)rnd.getInt(0, params.maxSampleSkip) : 1)
		{
			const deUint32	minDist2RefToCmp	= distSquaredToNeighbor<4>(rnd, readUnorm8<4>(refAccess, x, y), cmpAccess, x, y);
			const deUint32	minDist2CmpToRef	= distSquaredToNeighbor<4>(rnd, readUnorm8<4>(cmpAccess, x, y), refAccess, x, y);
			const deUint32	minDist2			= de::min(minDist2RefToCmp, minDist2CmpToRef);
			const deUint64	newSum4				= distSum4 + minDist2*minDist2;

			distSum4	 = (newSum4 >= distSum4) ? newSum4 : ~0ull; // In case of overflow
			numSamples	+= 1;

			// Build error image.
			{
				const int	scale	= 255-MIN_ERR_THRESHOLD;
				const float	err2	= float(minDist2) / float(scale*scale);
				const float	err4	= err2*err2;
				const float	red		= err4 * 500.0f;
				const float	luma	= toGrayscale(cmp.getPixel(x, y));
				const float	rF		= 0.7f + 0.3f*luma;

				errorMask.setPixel(Vec4(red*rF, (1.0f-red)*rF, 0.0f, 1.0f), x, y);
			}
		}
	}

	{
		// Scale error sum based on number of samples taken
		const double	pSamples	= double((width-2) * (height-2)) / double(numSamples);
		const deUint64	colScale	= deUint64(255-MIN_ERR_THRESHOLD);
		const deUint64	colScale4	= colScale*colScale*colScale*colScale;

		return float(double(distSum4) / double(colScale4) * pSamples);
	}
}